

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O1

void print_function_name(Section *sec,unsigned_long offs)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  Symbol *pSVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  
  uVar2 = 0;
  pSVar4 = (Symbol *)0x0;
  do {
    for (pSVar6 = sec->obj->objsyms[uVar2]; uVar3 = uVar2, pSVar6 != (Symbol *)0x0;
        pSVar6 = pSVar6->obj_chain) {
      pSVar5 = pSVar4;
      if ((((pSVar6->relsect == sec) && (pSVar6->info < 3)) && (pSVar6->type == '\x02')) &&
         (uVar1 = pSVar6->value, uVar1 <= offs)) {
        if ((ulong)pSVar6->size == 0) {
          pSVar5 = pSVar6;
          if (((pSVar4 != (Symbol *)0x0) && (pSVar5 = pSVar4, pSVar4->value < (long)uVar1)) &&
             ((pSVar4->bind < 2 || (1 < pSVar6->bind)))) {
            pSVar5 = pSVar6;
          }
        }
        else if (offs < uVar1 + pSVar6->size) {
          uVar3 = 0x20;
          pSVar4 = pSVar6;
          break;
        }
      }
      pSVar4 = pSVar5;
    }
    uVar2 = uVar3 + 1;
    if (0x1e < (int)uVar3) {
      if ((pSVar4 != (Symbol *)0x0) && (pSVar4 != print_function_name::last_func)) {
        print_function_name_cold_1();
      }
      return;
    }
  } while( true );
}

Assistant:

void print_function_name(struct Section *sec,unsigned long offs)
/* Try to determine the function to which the section offset */
/* belongs, by comparing with SYMI_FUNC-type symbol definitions. */
/* If this was successful and the current function is different */
/* from the last one printed, make an output to stderr. */
{
  static const char *infoname[] = { "", "object ", "function " };
  static struct Symbol *last_func=NULL;
  struct Symbol *sym,*func=NULL;
  int i;

  for (i=0; i<OBJSYMHTABSIZE; i++) {  /* scan all hash chains */
    for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
      if (sym->relsect == sec) {
        if (sym->info <= SYMI_FUNC) {
          if (sym->type == SYM_RELOC) {
            if ((unsigned long)sym->value <= offs) {
              if (sym->size) {  /* size of function specified? */
                if ((unsigned long)(sym->value+sym->size) > offs) {
                  func = sym;
                  i = OBJSYMHTABSIZE;
                  break;  /* function found! */
                }
              }
              else {  /* no size - find nearest... */
                if (func) {
                  if (sym->value > func->value) {
                    if (func->bind<SYMB_GLOBAL || sym->bind>=SYMB_GLOBAL)
                      func = sym;
                  }
                }
                else
                  func = sym;
              }
            }
          }
        }
      }
    }
  }

  /* print function name */
  if (func && func!=last_func) {
    last_func = func;
    fprintf(stderr,"%s: In %s\"%s\":\n",getobjname(sec->obj),
            infoname[func->info],func->name);
  }
}